

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O1

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::append<int>(ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
              *this,int aValue,int aBase,uint8_t aFill)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  char tmpBuffer [100];
  
  if (0xfffffff0 < aBase - 0x11U) {
    if (aBase == 0x10) {
      if (this->mBegin < this->mEnd) {
        *this->mBegin = '0';
        this->mBegin = this->mBegin + 1;
      }
      if (this->mBegin < this->mEnd) {
        *this->mBegin = 'x';
        goto LAB_001040a3;
      }
    }
    else if (aBase != 10) {
      if (aBase == 2) {
        if (this->mBegin < this->mEnd) {
          *this->mBegin = '0';
          this->mBegin = this->mBegin + 1;
        }
        if (this->mBegin < this->mEnd) {
          *this->mBegin = 'b';
LAB_001040a3:
          this->mBegin = this->mBegin + 1;
        }
      }
      else {
        if (this->mBegin < this->mEnd) {
          *this->mBegin = '0';
          this->mBegin = this->mBegin + 1;
        }
        if (this->mBegin < this->mEnd) {
          *this->mBegin = '!';
          goto LAB_001040a3;
        }
      }
    }
    uVar7 = 0;
    iVar3 = aValue;
    do {
      uVar8 = uVar7;
      iVar4 = iVar3 / aBase;
      uVar6 = iVar3 % aBase;
      uVar1 = -uVar6;
      if (0 < (int)uVar6) {
        uVar1 = uVar6;
      }
      tmpBuffer[uVar8] = "0123456789abcdef"[uVar1];
      uVar7 = uVar8 + 1;
    } while ((uVar8 < 99) && (iVar3 = iVar4, iVar4 != 0));
    if (uVar8 < 99) {
      if ((aValue < 0) && (this->mBegin < this->mEnd)) {
        *this->mBegin = '-';
        this->mBegin = this->mBegin + 1;
      }
      if (((byte)uVar7 < aFill) && (aFill != (byte)uVar7)) {
        uVar5 = aFill - uVar7;
        do {
          if (this->mBegin < this->mEnd) {
            *this->mBegin = '0';
            this->mBegin = this->mBegin + 1;
          }
          bVar2 = (char)uVar5 - 1;
          uVar5 = (ulong)bVar2;
        } while (bVar2 != 0);
      }
      if (uVar7 != 1) {
        do {
          uVar7 = uVar8 - 1;
          if (this->mBegin < this->mEnd) {
            *this->mBegin = tmpBuffer[uVar8];
            this->mBegin = this->mBegin + 1;
          }
          uVar8 = uVar7;
        } while ((char)uVar7 != '\0');
      }
      if (this->mEnd <= this->mBegin) {
        return;
      }
      *this->mBegin = tmpBuffer[0];
      goto LAB_00104162;
    }
  }
  if (this->mEnd <= this->mBegin) {
    return;
  }
  *this->mBegin = '#';
LAB_00104162:
  this->mBegin = this->mBegin + 1;
  return;
}

Assistant:

void append(tValue const aValue, tValue const aBase, uint8_t const aFill) noexcept {
    tValue tmpValue = aValue;
    uint8_t tmpFill = aFill;
    if((aBase <= NumericSystem::csInvalid) || (aBase > NumericSystem::csBaseMax)) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(tAppendBasePrefix) {
      if (aBase == 2u) {
        append(csNumericFill);
        append(csNumericMarkBinary);
      }
      else if(aBase == 16u) {
        append(csNumericFill);
        append(csNumericMarkHexadecimal);
      }
      else if(aBase != 10u) {
        append(csNumericFill);
        append(csNumericMarkOther);
      }
      else { // nothing to do
      }
    }
    char tmpBuffer[tAppendStackBufferSize];
    uint8_t where = 0u;
    bool negative = aValue < 0;
    do {
      tValue mod = tmpValue % aBase;
      if(mod < 0) {
        mod = -mod;
      }
      else { // nothing to do
      }
      tmpBuffer[where] = csDigit2char[mod];
      ++where;
      tmpValue /= aBase;
    } while((tmpValue != 0) && (where < tAppendStackBufferSize));
    if(where >= tAppendStackBufferSize) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(negative) {
      append(csMinus);
    }
    else if(tAlignSigned && (aFill > 0u)) {
      append(csSpace);
    }
    else { // nothing to do
    }
    if(tmpFill > where) {
      tmpFill -= where;
      while(tmpFill > 0u) {
        append(csNumericFill);
        --tmpFill;
      }
    }
    for(--where; where > 0u; --where) {
      append(tmpBuffer[where]);
    }
    append(tmpBuffer[0]);
  }